

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O2

void pzgeom::TPZGeoBlend<pzgeom::TPZGeoCube>::InsertExampleElement
               (TPZGeoMesh *gmesh,int matid,TPZVec<double> *lowercorner,TPZVec<double> *size)

{
  TPZGeoEl *pTVar1;
  long lVar2;
  TPZGeoElRefPattern<pzgeom::TPZWavyLine> *this;
  int i;
  ulong uVar3;
  int64_t index;
  TPZManVector<long,_3> nodeindexes;
  TPZManVector<double,_3> wavedir;
  
  TPZGeoCube::InsertExampleElement(gmesh,-1,lowercorner,size);
  lVar2 = (gmesh->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  TPZManVector<long,_3>::TPZManVector(&nodeindexes,8);
  pTVar1 = TPZGeoMesh::Element(gmesh,lVar2 + -1);
  for (uVar3 = 0; uVar3 != 8; uVar3 = uVar3 + 1) {
    lVar2 = (**(code **)(*(long *)pTVar1 + 0xa8))(pTVar1,uVar3 & 0xffffffff);
    nodeindexes.super_TPZVec<long>.fStore[uVar3] = lVar2;
  }
  this = (TPZGeoElRefPattern<pzgeom::TPZWavyLine> *)operator_new(0x108);
  TPZGeoElRefPattern<pzgeom::TPZWavyLine>::TPZGeoElRefPattern
            (this,&nodeindexes.super_TPZVec<long>,matid,gmesh);
  index = 0x3f947ae147ae147b;
  TPZManVector<double,_3>::TPZManVector(&wavedir,3,(double *)&index);
  *wavedir.super_TPZVec<double>.fStore = 0.0;
  TPZWavyLine::SetData
            (&(this->super_TPZGeoElRefLess<pzgeom::TPZWavyLine>).fGeo,&wavedir.super_TPZVec<double>,
             2);
  if (pTVar1 != (TPZGeoEl *)0x0) {
    (**(code **)(*(long *)pTVar1 + 8))(pTVar1);
  }
  (*(gmesh->super_TPZSavable)._vptr_TPZSavable[0xd])(gmesh,7,&nodeindexes,matid,&index);
  TPZManVector<double,_3>::~TPZManVector(&wavedir);
  TPZManVector<long,_3>::~TPZManVector(&nodeindexes);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::InsertExampleElement(TPZGeoMesh &gmesh, int matid, TPZVec<REAL> &lowercorner, TPZVec<REAL> &size)
{
    
    TGeo::InsertExampleElement(gmesh, -1, lowercorner, size);
    int64_t elid = gmesh.ElementVec().NElements()-1;
    TPZManVector<int64_t,3> nodeindexes(8);
    TPZGeoEl *gel = gmesh.Element(elid);
    int NNodes = TGeo::NCornerNodes;
    for (int i=0; i<NNodes; i++) {
        nodeindexes[i] = gel->NodeIndex(i);
    }
    TPZGeoElRefPattern<TPZWavyLine> *gelwave = new TPZGeoElRefPattern<TPZWavyLine>(nodeindexes,matid,gmesh);
    TPZManVector<REAL,3> wavedir(3,0.02);
    wavedir[0] = 0.;
    gelwave->Geom().SetData(wavedir, 2);
    delete gel;
    int64_t index;
    gmesh.CreateGeoBlendElement(TGeo::Type(), nodeindexes, matid, index);
}